

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O3

bool __thiscall lexical::analyse_identifier(lexical *this,iterator *it,Meta *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int column;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  Token t;
  string buf;
  Token TStack_a8;
  string local_78;
  Symbol local_58;
  
  paVar1 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  pcVar6 = it->_M_current;
  iVar5 = 0;
  bVar4 = false;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  if (pcVar6 != (m->end)._M_current) {
    do {
      if (iVar5 == 0) {
        pcVar6 = pcVar6 + -1;
        it->_M_current = pcVar6;
LAB_0010a91a:
        iVar5 = 1;
      }
      else {
        if (iVar5 != 1) {
          iVar5 = m->line;
          column = m->column;
          bVar4 = Table::in_key(&this->table,&local_78);
          Token::Token(&TStack_a8,iVar5,column,(uint)!bVar4 + (uint)!bVar4 * 2 + 1,&local_78);
          std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,&TStack_a8);
          if (TStack_a8.type == 4) {
            paVar2 = &local_58.name.field_2;
            local_58.type = 4;
            paVar3 = &TStack_a8.name.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)TStack_a8.name._M_dataplus._M_p == paVar3) {
              local_58.name.field_2._8_8_ = TStack_a8.name.field_2._8_8_;
              local_58.name._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_58.name._M_dataplus._M_p = TStack_a8.name._M_dataplus._M_p;
            }
            local_58.name._M_string_length = TStack_a8.name._M_string_length;
            TStack_a8.name._M_string_length = 0;
            TStack_a8.name.field_2._M_local_buf[0] = '\0';
            TStack_a8.name._M_dataplus._M_p = (pointer)paVar3;
            std::
            _Rb_tree<Symbol,_Symbol,_std::_Identity<Symbol>,_std::less<Symbol>,_std::allocator<Symbol>_>
            ::_M_insert_unique<Symbol>(&(this->symbols)._M_t,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58.name._M_dataplus._M_p != paVar2) {
              operator_delete(local_58.name._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)TStack_a8.name._M_dataplus._M_p != &TStack_a8.name.field_2) {
            operator_delete(TStack_a8.name._M_dataplus._M_p);
          }
          bVar4 = true;
          goto LAB_0010aa11;
        }
        bVar4 = sutil::is_key(pcVar6,false);
        if (bVar4) {
          std::__cxx11::string::push_back((char)&local_78);
          pcVar6 = it->_M_current;
          goto LAB_0010a91a;
        }
        pcVar6 = it->_M_current + -1;
        it->_M_current = pcVar6;
        iVar5 = 2;
      }
      pcVar6 = pcVar6 + 1;
      it->_M_current = pcVar6;
    } while (pcVar6 != (m->end)._M_current);
    bVar4 = false;
  }
LAB_0010aa11:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool lexical::analyse_identifier(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;
    while (it != m.end) {
        switch (state) {
            case 0: {
                --it;
                state = 1;
                break;
            }
            case 1: {
                if (sutil::is_key(*it))buf.push_back(*it);
                else {
                    --it;
                    state = 2;
                }
                break;
            }
            case 2: {
                Token t(m.line, m.column, table.in_key(buf) ? Token::KEY_WORD : Token::IDENTIFIER, buf);
                tokens.push_back(t);
                if(t.type == Token::IDENTIFIER) {
                    symbols.insert(Symbol(t.type, t.name));
                }
                return true;
            }
        }
        ++it;
    }
    return false;
}